

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
defyx::CompiledVm<defyx::AlignedAllocator<64UL>,_true>::run
          (CompiledVm<defyx::AlignedAllocator<64UL>,_true> *this,void *seed)

{
  ProgramConfiguration *in_RSI;
  Program *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  defyx_vm *in_stack_00000040;
  Program *prog;
  
  prog = in_RDI;
  VmBase<defyx::AlignedAllocator<64UL>,_true>::generateProgram
            ((VmBase<defyx::AlignedAllocator<64UL>,_true> *)in_RSI,in_RDI);
  defyx_vm::initialize(in_stack_00000040);
  JitCompilerX86::generateProgram(unaff_retaddr,prog,in_RSI);
  in_RDI[1].programBuffer[0x1d] =
       (Instruction)(*(long *)in_RDI[1].programBuffer[0x1f] + (long)in_RDI[1].programBuffer[0x20]);
  execute((CompiledVm<defyx::AlignedAllocator<64UL>,_true> *)in_RSI);
  return;
}

Assistant:

void CompiledVm<Allocator, softAes>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		defyx_vm::initialize();
		compiler.generateProgram(program, config);
		mem.memory = datasetPtr->memory + datasetOffset;
		execute();
	}